

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recvfrom_op.hpp
# Opt level: O2

void asio::detail::
     reactive_socket_recvfrom_op<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:819:9)>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  anon_class_8_1_8991fb9c this;
  unsigned_long uVar1;
  bool bVar2;
  OutputWorker *this_00;
  Result result;
  binder2<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:819:9),_std::error_code,_unsigned_long>
  handler;
  undefined1 local_1d0 [24];
  string local_1b8;
  undefined1 local_198 [16];
  ostringstream aoStack_188 [376];
  
  local_1d0._0_8_ = &handler;
  handler.handler_.this = (SSDPRequester *)base[4].next_;
  handler.arg1_._0_8_ = base[1].next_;
  handler.arg1_._M_cat = (error_category *)base[1].func_;
  handler.arg2_ = *(unsigned_long *)&base[1].task_result_;
  local_1d0._8_8_ = base;
  local_1d0._16_8_ = base;
  ptr::reset((ptr *)local_1d0);
  uVar1 = handler.arg2_;
  this.this = handler.handler_.this;
  if (owner != (void *)0x0) {
    if (handler.arg1_._M_value == 0) {
      if (handler.arg2_ == 0) goto LAB_00132096;
    }
    else {
      local_198[0] = ((handler.handler_.this)->SourceAddress).impl_.data_.base.sa_family != 2;
      if ((bool)local_198[0]) {
        local_198._8_8_ =
             *(undefined8 *)((long)&((handler.handler_.this)->SourceAddress).impl_.data_ + 8);
        aoStack_188._0_8_ =
             *(uchar (*) [8])((long)&((handler.handler_.this)->SourceAddress).impl_.data_ + 0x10);
        aoStack_188._8_8_ =
             ZEXT48(((handler.handler_.this)->SourceAddress).impl_.data_.v6.sin6_scope_id);
        local_198._4_4_ = 0;
      }
      else {
        local_198._4_4_ = ((handler.handler_.this)->SourceAddress).impl_.data_.v6.sin6_flowinfo;
        aoStack_188[8] = (ostringstream)0x0;
        aoStack_188[9] = (ostringstream)0x0;
        aoStack_188[10] = (ostringstream)0x0;
        aoStack_188[0xb] = (ostringstream)0x0;
        aoStack_188[0xc] = (ostringstream)0x0;
        aoStack_188[0xd] = (ostringstream)0x0;
        aoStack_188[0xe] = (ostringstream)0x0;
        aoStack_188[0xf] = (ostringstream)0x0;
        local_198._8_8_ = 0;
        aoStack_188[0] = (ostringstream)0x0;
        aoStack_188[1] = (ostringstream)0x0;
        aoStack_188[2] = (ostringstream)0x0;
        aoStack_188[3] = (ostringstream)0x0;
        aoStack_188[4] = (ostringstream)0x0;
        aoStack_188[5] = (ostringstream)0x0;
        aoStack_188[6] = (ostringstream)0x0;
        aoStack_188[7] = (ostringstream)0x0;
      }
      local_198._1_3_ = 0;
      bVar2 = asio::ip::address::is_unspecified((address *)local_198);
      if (uVar1 == 0 || bVar2) goto LAB_00132096;
    }
    tonk::gateway::SSDPRequester::OnUDPDatagram
              ((SSDPRequester *)&result,(char *)this.this,(int)this.this + 0xa0);
    if (result.Error != (ErrorResult *)0x0) {
      tonk::Result::ToJson_abi_cxx11_(&local_1b8,&result);
      if (DAT_0019e060 < 4) {
        local_198._0_8_ = tonk::gateway::ModuleLogger._M_head_impl;
        local_198._8_4_ = 3;
        std::__cxx11::ostringstream::ostringstream(aoStack_188);
        std::operator<<((ostream *)aoStack_188,(string *)&DAT_0019e090);
        std::operator<<((ostream *)aoStack_188,"SSDP datagram rejected: ");
        std::operator<<((ostream *)aoStack_188,(string *)&local_1b8);
        this_00 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(this_00,(LogStringBuffer *)local_198);
        std::__cxx11::ostringstream::~ostringstream(aoStack_188);
      }
      std::__cxx11::string::~string((string *)&local_1b8);
    }
    tonk::gateway::SSDPRequester::PostNextRead_UDP(this.this);
    tonk::Result::~Result(&result);
  }
LAB_00132096:
  ptr::~ptr((ptr *)local_1d0);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    reactive_socket_recvfrom_op* o(
        static_cast<reactive_socket_recvfrom_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };
    handler_work<Handler> w(o->handler_);

    ASIO_HANDLER_COMPLETION((*o));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder2<Handler, asio::error_code, std::size_t>
      handler(o->handler_, o->ec_, o->bytes_transferred_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_, handler.arg2_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }